

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

Ea<(moira::Mode)7,_2> * __thiscall
moira::Moira::Op<(moira::Mode)7,2>
          (Ea<(moira::Mode)7,_2> *__return_storage_ptr__,Moira *this,u16 reg,u32 *pc)

{
  u32 uVar1;
  Ea<(moira::Mode)7,_2> *result;
  u32 *pc_local;
  u16 reg_local;
  Moira *this_local;
  
  __return_storage_ptr__->reg = reg;
  __return_storage_ptr__->pc = *pc;
  uVar1 = dasmIncRead<2>(this,pc);
  __return_storage_ptr__->ext1 = uVar1;
  return __return_storage_ptr__;
}

Assistant:

Ea<M,S>
Moira::Op(u16 reg, u32 &pc) const
{
    Ea<M,S> result;
    result.reg = reg;
    result.pc = pc;

    // Read extension words
    switch (M)
    {
        case Mode(5):  // (d,An)
        case Mode(7):  // ABS.W
        case Mode(9):  // (d,PC)
        {
            result.ext1 = dasmIncRead<Word>(pc);
            break;
        }
        case Mode(8):  // ABS.L
        {
            result.ext1 = dasmIncRead<Word>(pc);
            result.ext1 = result.ext1 << 16 | dasmIncRead<Word>(pc);
            break;
        }
        case Mode(6):  // (d,An,Xi)
        case Mode(10): // (d,PC,Xi)
        {
            result.ext1 = dasmIncRead<Word>(pc);
            result.ext2 = 0;
            result.ext3 = 0;

            if (result.ext1 & 0x100) {

                result.dw = u8(baseDispWords((u16)result.ext1));
                result.ow = u8(outerDispWords((u16)result.ext1));

                // Compensate Musashi bug (?)
                if (instrStyle.syntax == Syntax::MUSASHI && (result.ext1 & 0x47) >= 0x44) {

                    result.ow = 0;
                }

                if (result.dw == 1) result.ext2 = (i16)dasmIncRead<Word>(pc);
                if (result.dw == 2) result.ext2 = (i32)dasmIncRead<Long>(pc);
                if (result.ow == 1) result.ext3 = (i16)dasmIncRead<Word>(pc);
                if (result.ow == 2) result.ext3 = (i32)dasmIncRead<Long>(pc);
            }
            break;
        }
        case Mode(11): // Imm
        {
            result.ext1 = dasmIncRead<S>(pc);
            break;
        }
        default:
        {
            break;
        }
    }

    return result;
}